

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaCorot_8.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementHexaCorot_8::ShapeFunctions
          (ChElementHexaCorot_8 *this,ShapeVector *N,double z0,double z1,double z2)

{
  double dVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  
  auVar4 = vpermi2pd_avx512f(_DAT_00ec4740,ZEXT864((ulong)(1.0 - z2)),
                             ZEXT1664(CONCAT88(z2 + 1.0,z2 + 1.0)));
  auVar2 = vpermpd_avx2(ZEXT1632(CONCAT88(z0 + 1.0,1.0 - z0)),0x24);
  auVar3._8_8_ = 0x3fc0000000000000;
  auVar3._0_8_ = 0x3fc0000000000000;
  auVar3._16_8_ = 0x3fc0000000000000;
  auVar3._24_8_ = 0x3fc0000000000000;
  auVar2 = vmulpd_avx512vl(auVar2,auVar3);
  dVar1 = z1 + 1.0;
  auVar7._8_8_ = dVar1;
  auVar7._0_8_ = dVar1;
  auVar7._16_8_ = dVar1;
  auVar7._24_8_ = dVar1;
  auVar2 = vblendpd_avx(auVar2,auVar7,4);
  auVar3 = vpermi2pd_avx512vl(_DAT_00ec4840,ZEXT832((ulong)(1.0 - z1)),auVar2);
  auVar6._0_8_ = auVar2._0_8_ * auVar3._0_8_;
  auVar6._8_8_ = auVar2._8_8_ * auVar3._8_8_;
  auVar6._16_8_ = auVar2._16_8_ * auVar3._16_8_;
  auVar6._24_8_ = auVar2._24_8_ * auVar3._24_8_;
  auVar5 = vinsertf64x4_avx512f(ZEXT3264(auVar6),auVar6,1);
  auVar4 = vmulpd_avx512f(auVar5,auVar4);
  *(undefined1 (*) [64])
   (N->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array = auVar4
  ;
  return;
}

Assistant:

void ChElementHexaCorot_8::ShapeFunctions(ShapeVector& N, double z0, double z1, double z2) {
    double sc = 1. / 8.;
    N(0) = sc * (1 - z0) * (1 - z1) * (1 - z2);
    N(1) = sc * (1 + z0) * (1 - z1) * (1 - z2);
    N(2) = sc * (1 + z0) * (1 + z1) * (1 - z2);
    N(3) = sc * (1 - z0) * (1 + z1) * (1 - z2);
    N(4) = sc * (1 - z0) * (1 - z1) * (1 + z2);
    N(5) = sc * (1 + z0) * (1 - z1) * (1 + z2);
    N(6) = sc * (1 + z0) * (1 + z1) * (1 + z2);
    N(7) = sc * (1 - z0) * (1 + z1) * (1 + z2);
}